

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg.c
# Opt level: O2

double ogg_stream_get_length(ALLEGRO_AUDIO_STREAM *stream)

{
  double dVar1;
  
  dVar1 = (double)ov_time_total(*stream->extra,0xffffffffffffffff);
  return dVar1;
}

Assistant:

static double ogg_stream_get_length(ALLEGRO_AUDIO_STREAM *stream)
{
   AL_OV_DATA *extra = (AL_OV_DATA *) stream->extra;
#ifndef TREMOR
   double ret = lib.ov_time_total(extra->vf, -1);
#else
   double ret = lib.ov_time_total(extra->vf, -1)/1000.0;
#endif
   return ret;
}